

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_reader.cc
# Opt level: O0

size_type_conflict __thiscall
lf::io::GmshReader::PhysicalEntityName2Nr(GmshReader *this,string *name,dim_t codim)

{
  bool bVar1;
  reference ppVar2;
  LfException *pLVar3;
  pointer ppVar4;
  byte local_459;
  string local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  undefined1 local_361;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined4 local_31c;
  undefined1 local_318 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>
  result;
  string local_2e8;
  type *local_2c8;
  type *end;
  type *begin;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [380];
  uint local_24;
  string *psStack_20;
  dim_t codim_local;
  string *name_local;
  GmshReader *this_local;
  
  local_24 = codim;
  psStack_20 = name;
  name_local = (string *)this;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (name);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::operator<<(local_1a0,"name is empty");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"!name.empty()",&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
               ,&local_209);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e0,&local_208,0x24,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"false",&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
               ,&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"",&local_2a1);
    lf::base::AssertionFailed(&local_250,&local_278,0x24,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    abort();
  }
  _begin = std::
           multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
           ::equal_range(&this->name_2_nr_,psStack_20);
  end = std::
        get<0ul,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>>
                  ((pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                    *)&begin);
  local_2c8 = std::
              get<1ul,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>>
                        ((pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                          *)&begin);
  bVar1 = std::operator==(end,local_2c8);
  if (bVar1) {
    result.second.second._2_1_ = 1;
    pLVar3 = (LfException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"No Physical Entity with this name found.",
               (allocator<char> *)((long)&result.second.second + 3));
    lf::base::LfException::LfException(pLVar3,&local_2e8);
    result.second.second._2_1_ = 0;
    __cxa_throw(pLVar3,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
  }
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator*(end);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>
  ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>
          *)local_318,ppVar2);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator++(end);
  bVar1 = std::operator==(end,local_2c8);
  if (bVar1) {
    if ((local_24 != 0xffffffff) && (local_24 != result.first.field_2._12_4_)) {
LAB_004e92f7:
      pLVar3 = (LfException *)__cxa_allocate_exception(0x28);
      std::operator+(&local_3e8,"Physical Entity with name=\'",psStack_20);
      std::operator+(&local_3c8,&local_3e8,"\' and codimension=");
      std::__cxx11::to_string(&local_408,local_24);
      std::operator+(&local_3a8,&local_3c8,&local_408);
      std::operator+(&local_388,&local_3a8,"\' not found.");
      lf::base::LfException::LfException(pLVar3,&local_388);
      __cxa_throw(pLVar3,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
    }
    this_local._4_4_ = result.first.field_2._8_4_;
  }
  else {
    if (local_24 == 0xffffffff) {
      local_361 = 1;
      pLVar3 = (LfException *)__cxa_allocate_exception(0x28);
      std::operator+(&local_360,"There are multiple physical entities with the name ",psStack_20);
      std::operator+(&local_340,&local_360,", please specify also the codimension.");
      lf::base::LfException::LfException(pLVar3,&local_340);
      local_361 = 0;
      __cxa_throw(pLVar3,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
    }
    if (result.first.field_2._12_4_ == local_24) {
      this_local._4_4_ = result.first.field_2._8_4_;
    }
    else {
      while( true ) {
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
                 ::operator->(end);
        local_459 = 0;
        if ((ppVar4->second).second != local_24) {
          bVar1 = std::operator==(end,local_2c8);
          local_459 = bVar1 ^ 0xff;
        }
        if ((local_459 & 1) == 0) break;
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
        ::operator++(end);
      }
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
               ::operator->(end);
      if ((ppVar4->second).second != local_24) goto LAB_004e92f7;
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>
               ::operator->(end);
      this_local._4_4_ = (ppVar4->second).first;
    }
  }
  local_31c = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>
           *)local_318);
  return this_local._4_4_;
}

Assistant:

size_type GmshReader::PhysicalEntityName2Nr(const std::string& name,
                                            dim_t codim) const {
  LF_ASSERT_MSG(!name.empty(), "name is empty");
  auto [begin, end] = name_2_nr_.equal_range(name);  // NOLINT
  if (begin == end) {
    throw base::LfException("No Physical Entity with this name found.");
  }
  auto result = *begin;
  ++begin;
  if (begin == end) {
    if (codim == static_cast<dim_t>(-1) || codim == result.second.second) {
      return result.second.first;
    }
  } else {
    if (codim == static_cast<dim_t>(-1)) {
      throw base::LfException(
          "There are multiple physical entities with the name " + name +
          ", please specify also the codimension.");
    }
    if (result.second.second == codim) {
      return result.second.first;
    }
    while (begin->second.second != codim && begin != end) {
      ++begin;
    }
    if (begin->second.second == codim) {
      return begin->second.first;
    }
  }
  throw base::LfException("Physical Entity with name='" + name +
                          "' and codimension=" + std::to_string(codim) +
                          "' not found.");
}